

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintDouble
          (FastFieldValuePrinter *this,double val,BaseTextGenerator *generator)

{
  uint uVar1;
  string *in_RSI;
  double in_RDI;
  bool bVar2;
  double in_XMM0_Qa;
  BaseTextGenerator *in_stack_ffffffffffffffb0;
  allocator local_39;
  string local_38 [48];
  
  uVar1 = std::isnan(in_XMM0_Qa);
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"nan",&local_39);
  }
  else {
    SimpleDtoa_abi_cxx11_(in_RDI);
  }
  BaseTextGenerator::PrintString(in_stack_ffffffffffffffb0,in_RSI);
  std::__cxx11::string::~string(local_38);
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintDouble(
    double val, BaseTextGenerator* generator) const {
  generator->PrintString(!std::isnan(val) ? SimpleDtoa(val) : "nan");
}